

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O0

void __thiscall Screen::indicateMoreText(Screen *this)

{
  undefined1 local_98 [8];
  char inputText [100];
  string formattedInput;
  Screen *this_local;
  
  std::__cxx11::string::string((string *)(inputText + 0x60));
  local_98[0] = 0;
  clearWindow(this,this->inputScreen);
  wrefresh(this->inputScreen);
  mvwprintw(this->inputScreen,1,1,"> ");
  wprintw(this->inputScreen,"[MORE TEXT, PRESS ENTER]");
  wgetnstr(this->inputScreen,local_98,0xffffffff);
  std::__cxx11::string::~string((string *)(inputText + 0x60));
  return;
}

Assistant:

void Screen::indicateMoreText() {
    std::string formattedInput;
    char inputText[MAX_INPUT_LENGTH];
    inputText[0] = '\0';

    // Clear the input area
    clearWindow(inputScreen);
    wrefresh(inputScreen);

    // Move the cursor to the correct location
    mvwprintw(inputScreen, 1, 1, "> ");
    wprintw(inputScreen, "[MORE TEXT, PRESS ENTER]");
    // Get a string of console input
    wgetstr(inputScreen, inputText);
}